

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O2

void HUD_InitHud(void)

{
  bool bVar1;
  int lumpnum;
  FTextureID FVar2;
  PClass *ti;
  char *pcVar3;
  int lastlump;
  FScanner sc;
  
  if (gameinfo.gametype == GAME_Heretic) {
LAB_00579bda:
    healthpic = FTextureManager::FindTexture(&TexMan,"ARTIPTN2",8,1);
    pcVar3 = "HUDFONT_RAVEN";
  }
  else {
    if (gameinfo.gametype == GAME_Strife) {
      healthpic = FTextureManager::FindTexture(&TexMan,"I_MDKT",8,1);
      HudFont = BigFont;
      goto LAB_00579c7f;
    }
    if (gameinfo.gametype == GAME_Hexen) goto LAB_00579bda;
    healthpic = FTextureManager::FindTexture(&TexMan,"MEDIA0",8,1);
    berserkpic = FTextureManager::FindTexture(&TexMan,"PSTRA0",8,1);
    pcVar3 = "HUDFONT_DOOM";
  }
  HudFont = FFont::FindFont(pcVar3);
LAB_00579c7f:
  IndexFont = V_GetFont("INDEXFONT");
  if (HudFont == (FFont *)0x0) {
    HudFont = BigFont;
  }
  if (IndexFont == (FFont *)0x0) {
    IndexFont = ConFont;
  }
  invgems[0] = FTextureManager::FindTexture(&TexMan,"INVGEML1",8,1);
  invgems[1] = FTextureManager::FindTexture(&TexMan,"INVGEML2",8,1);
  invgems[2] = FTextureManager::FindTexture(&TexMan,"INVGEMR1",8,1);
  invgems[3] = FTextureManager::FindTexture(&TexMan,"INVGEMR2",8,1);
  fragpic = FTextureManager::FindTexture(&TexMan,"HU_FRAGS",8,1);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&KeyTypes);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&UnassignedKeyTypes);
  statspace = FFont::StringWidth(SmallFont,(BYTE *)"Ac:");
  lastlump = 0;
  do {
    lumpnum = FWadCollection::FindLump(&Wads,"ALTHUDCF",&lastlump,false);
    if (lumpnum == -1) {
      return;
    }
    FScanner::FScanner(&sc,lumpnum);
    while (bVar1 = FScanner::GetString(&sc), bVar1) {
      bVar1 = FScanner::Compare(&sc,"Health");
      if (bVar1) {
        FScanner::MustGetString(&sc);
        FVar2 = FTextureManager::CheckForTexture(&TexMan,sc.String,8,1);
        if (0 < FVar2.texnum) {
          if ((uint)FVar2.texnum < TexMan.Textures.Count) {
            healthpic = TexMan.Textures.Array[(uint)FVar2.texnum].Texture;
          }
          else {
            healthpic = (FTexture *)0x0;
          }
        }
      }
      else {
        bVar1 = FScanner::Compare(&sc,"Berserk");
        if (bVar1) {
          FScanner::MustGetString(&sc);
          FVar2 = FTextureManager::CheckForTexture(&TexMan,sc.String,8,1);
          if (0 < FVar2.texnum) {
            if ((uint)FVar2.texnum < TexMan.Textures.Count) {
              berserkpic = TexMan.Textures.Array[(uint)FVar2.texnum].Texture;
            }
            else {
              berserkpic = (FTexture *)0x0;
            }
          }
        }
        else {
          ti = PClass::FindClass(sc.String);
          pcVar3 = "Unknown item class \'%s\' in ALTHUDCF\n";
          if (ti == (PClass *)0x0) {
LAB_00579eb2:
            Printf(pcVar3,sc.String);
            ti = (PClass *)0x0;
          }
          else {
            bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,ti);
            pcVar3 = "Invalid item class \'%s\' in ALTHUDCF\n";
            if (!bVar1) goto LAB_00579eb2;
          }
          FScanner::MustGetString(&sc);
          bVar1 = FScanner::Compare(&sc,"0");
          FVar2.texnum = -1;
          if (!bVar1) {
            bVar1 = FScanner::Compare(&sc,"NULL");
            FVar2.texnum = -1;
            if (!bVar1) {
              bVar1 = FScanner::Compare(&sc,(char *)"");
              FVar2.texnum = -1;
              if (!bVar1) {
                FVar2 = FTextureManager::CheckForTexture(&TexMan,sc.String,8,1);
              }
            }
          }
          if (ti != (PClass *)0x0) {
            *(int *)((long)&ti[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                            super_DObject.Class + 4) = FVar2.texnum;
          }
        }
      }
    }
    FScanner::~FScanner(&sc);
  } while( true );
}

Assistant:

void HUD_InitHud()
{
	switch (gameinfo.gametype)
	{
	case GAME_Heretic:
	case GAME_Hexen:
		healthpic = TexMan.FindTexture("ARTIPTN2");
		HudFont=FFont::FindFont("HUDFONT_RAVEN");
		break;

	case GAME_Strife:
		healthpic = TexMan.FindTexture("I_MDKT");
		HudFont=BigFont;	// Strife doesn't have anything nice so use the standard font
		break;

	default:
		healthpic = TexMan.FindTexture("MEDIA0");
		berserkpic = TexMan.FindTexture("PSTRA0");
		HudFont=FFont::FindFont("HUDFONT_DOOM");
		break;
	}

	IndexFont = V_GetFont("INDEXFONT");

	if (HudFont == NULL) HudFont = BigFont;
	if (IndexFont == NULL) IndexFont = ConFont;	// Emergency fallback

	invgems[0] = TexMan.FindTexture("INVGEML1");
	invgems[1] = TexMan.FindTexture("INVGEML2");
	invgems[2] = TexMan.FindTexture("INVGEMR1");
	invgems[3] = TexMan.FindTexture("INVGEMR2");

	fragpic = TexMan.FindTexture("HU_FRAGS");	// Sadly, I don't have anything usable for this. :(

	KeyTypes.Clear();
	UnassignedKeyTypes.Clear();

	statspace = SmallFont->StringWidth("Ac:");



	// Now read custom icon overrides
	int lump, lastlump = 0;

	while ((lump = Wads.FindLump ("ALTHUDCF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		while (sc.GetString())
		{
			if (sc.Compare("Health"))
			{
				sc.MustGetString();
				FTextureID tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				if (tex.isValid()) healthpic = TexMan[tex];
			}
			else if (sc.Compare("Berserk"))
			{
				sc.MustGetString();
				FTextureID tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				if (tex.isValid()) berserkpic = TexMan[tex];
			}
			else
			{
				PClass *ti = PClass::FindClass(sc.String);
				if (!ti)
				{
					Printf("Unknown item class '%s' in ALTHUDCF\n", sc.String);
				}
				else if (!ti->IsDescendantOf(RUNTIME_CLASS(AInventory)))
				{
					Printf("Invalid item class '%s' in ALTHUDCF\n", sc.String);
					ti=NULL;
				}
				sc.MustGetString();
				FTextureID tex;

				if (!sc.Compare("0") && !sc.Compare("NULL") && !sc.Compare(""))
				{
					tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				}
				else tex.SetInvalid();

				if (ti) SetHUDIcon(static_cast<PClassInventory*>(ti), tex);
			}
		}
	}
}